

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

Vec_Ptr_t * createMonotoneBarrierLO(Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers)

{
  Vec_Ptr_t *p;
  Aig_Obj_t *Entry;
  int nCap;
  bool bVar1;
  
  if ((vBarriers == (Vec_Ptr_t *)0x0) || (nCap = vBarriers->nSize, nCap < 1)) {
    p = (Vec_Ptr_t *)0x0;
  }
  else {
    p = Vec_PtrAlloc(nCap);
    while (bVar1 = nCap != 0, nCap = nCap + -1, bVar1) {
      Entry = Aig_ObjCreateCi(pAigNew);
      Vec_PtrPush(p,Entry);
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t *createMonotoneBarrierLO( Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers )
{
    Vec_Ptr_t *vMonotoneLO;
    int barrierCount;
    Aig_Obj_t *pObj;
    int i;

    if( vBarriers == NULL )
        return NULL;

    barrierCount = Vec_PtrSize(vBarriers);
    if( barrierCount <= 0 )
        return NULL;

    vMonotoneLO = Vec_PtrAlloc(barrierCount);    
    for( i=0; i<barrierCount; i++ )
    {
        pObj = Aig_ObjCreateCi( pAigNew );
        Vec_PtrPush( vMonotoneLO, pObj );
    }

    return vMonotoneLO;
}